

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void __thiscall el::Logger::configure(Logger *this,Configurations *configurations)

{
  Configurations *pCVar1;
  bool bVar2;
  undefined8 in_RAX;
  Configuration *pCVar3;
  TypedConfigurations *this_00;
  undefined8 uStack_28;
  
  this->m_isConfigured = false;
  uStack_28 = in_RAX;
  initUnflushedCount(this);
  if (this->m_typedConfigurations != (TypedConfigurations *)0x0) {
    pCVar1 = this->m_typedConfigurations->m_configurations;
    uStack_28 = CONCAT44(1,(undefined4)uStack_28);
    (*(pCVar1->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
      super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
      .super_ThreadSafe._vptr_ThreadSafe[2])(pCVar1);
    pCVar3 = base::utils::RegistryWithPred<el::Configuration,el::Configuration::Predicate>::
             get<el::Level,el::ConfigurationType>
                       ((RegistryWithPred<el::Configuration,el::Configuration::Predicate> *)pCVar1,
                        (Level *)((long)&uStack_28 + 4),Filename);
    if (pCVar3 != (Configuration *)0x0) {
      flush(this);
    }
  }
  (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])(this);
  pCVar1 = &this->m_configurations;
  bVar2 = base::utils::
          AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
          ::operator!=((AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)pCVar1,
                       (AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)configurations);
  if (bVar2) {
    Configurations::setFromBase(pCVar1,configurations);
  }
  if (this->m_typedConfigurations != (TypedConfigurations *)0x0) {
    (*(this->m_typedConfigurations->super_ThreadSafe)._vptr_ThreadSafe[4])();
    this->m_typedConfigurations = (TypedConfigurations *)0x0;
  }
  this_00 = (TypedConfigurations *)operator_new(0x200);
  base::TypedConfigurations::TypedConfigurations(this_00,pCVar1,this->m_logStreamsReference);
  this->m_typedConfigurations = this_00;
  resolveLoggerFormatSpec(this);
  this->m_isConfigured = true;
  return;
}

Assistant:

void Logger::configure(const Configurations& configurations) {
  m_isConfigured = false;  // we set it to false in case if we fail
  initUnflushedCount();
  if (m_typedConfigurations != nullptr) {
    Configurations* c = const_cast<Configurations*>(m_typedConfigurations->configurations());
    if (c->hasConfiguration(Level::Global, ConfigurationType::Filename)) {
      // This check is definitely needed for cases like ELPP_NO_DEFAULT_LOG_FILE
      flush();
    }
  }
  base::threading::ScopedLock scopedLock(lock());
  if (m_configurations != configurations) {
    m_configurations.setFromBase(const_cast<Configurations*>(&configurations));
  }
  base::utils::safeDelete(m_typedConfigurations);
  m_typedConfigurations = new base::TypedConfigurations(&m_configurations, m_logStreamsReference);
  resolveLoggerFormatSpec();
  m_isConfigured = true;
}